

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O2

void SetRotation(FLinePortal *port)

{
  line_t *plVar1;
  line_t *plVar2;
  double v;
  double dVar3;
  line_t *dst;
  undefined1 local_58 [16];
  double local_48;
  double dStack_40;
  double local_38;
  double dStack_30;
  
  if ((port != (FLinePortal *)0x0) && (plVar1 = port->mDestination, plVar1 != (line_t *)0x0)) {
    if (port->mType == '\x03') {
      port->mCosRot = 1.0;
      (port->mAngleDiff).Degrees = 0.0;
      port->mSinRot = 0.0;
    }
    else {
      plVar2 = port->mOrigin;
      local_38 = (plVar1->delta).X;
      dStack_30 = (plVar1->delta).Y;
      TVector2<double>::Angle((TVector2<double> *)(local_58 + 8));
      local_48 = (plVar2->delta).X;
      dStack_40 = (plVar2->delta).Y;
      TVector2<double>::Angle((TVector2<double> *)local_58);
      v = ((double)local_58._8_8_ - (double)local_58._0_8_) + 180.0;
      dVar3 = sindeg(v);
      port->mSinRot = dVar3;
      dVar3 = cosdeg(v);
      port->mCosRot = dVar3;
      (port->mAngleDiff).Degrees = v;
      if (((plVar2->sidedef[0]->Flags & 0x40) == 0) && ((plVar1->sidedef[0]->Flags & 0x40) == 0)) {
        port->mFlags = port->mFlags & 0xef;
      }
      else {
        port->mFlags = port->mFlags | 0x10;
      }
    }
  }
  return;
}

Assistant:

static void SetRotation(FLinePortal *port)
{
	if (port != nullptr && port->mDestination != nullptr)
	{
		if (port->mType != PORTT_LINKED)
		{
			line_t *dst = port->mDestination;
			line_t *line = port->mOrigin;
			DAngle angle = dst->Delta().Angle() - line->Delta().Angle() + 180.;
			port->mSinRot = sindeg(angle.Degrees);	// Here precision matters so use the slower but more precise versions.
			port->mCosRot = cosdeg(angle.Degrees);
			port->mAngleDiff = angle;
			if ((line->sidedef[0]->Flags & WALLF_POLYOBJ) || (dst->sidedef[0]->Flags & WALLF_POLYOBJ))
			{
				port->mFlags |= PORTF_POLYOBJ;
			}
			else
			{
				port->mFlags &= ~PORTF_POLYOBJ;
			}
		}
		else
		{
			// Linked portals have no angular difference.
			port->mSinRot = 0.;
			port->mCosRot = 1.;
			port->mAngleDiff = 0.;
		}
	}
}